

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDAnalyzer.cpp
# Opt level: O2

void __thiscall SWDAnalyzer::~SWDAnalyzer(SWDAnalyzer *this)

{
  SWDAnalyzerResults *pSVar1;
  
  *(undefined ***)this = &PTR__SWDAnalyzer_0010fca0;
  Analyzer::KillThread();
  std::_Vector_base<SWDBit,_std::allocator<SWDBit>_>::~_Vector_base
            (&(this->mSWDParser).mBitsBuffer.super__Vector_base<SWDBit,_std::allocator<SWDBit>_>);
  SWDSimulationDataGenerator::~SWDSimulationDataGenerator(&this->mSimulationDataGenerator);
  pSVar1 = (this->mResults)._M_ptr;
  if (pSVar1 != (SWDAnalyzerResults *)0x0) {
    (**(code **)(*(long *)pSVar1 + 8))();
  }
  SWDAnalyzerSettings::~SWDAnalyzerSettings(&this->mSettings);
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SWDAnalyzer::~SWDAnalyzer()
{
    KillThread();
}